

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9_STDOUT_Const(jx9_value *pVal,void *pUserData)

{
  void *pUserData_00;
  void *pResource;
  jx9_vm *pVm;
  void *pUserData_local;
  jx9_value *pVal_local;
  
  pUserData_00 = jx9ExportStdout((jx9_vm *)pUserData);
  jx9_value_resource(pVal,pUserData_00);
  return;
}

Assistant:

static void JX9_STDOUT_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	void *pResource;
	pResource = jx9ExportStdout(pVm);
	jx9_value_resource(pVal, pResource);
}